

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_entry.cpp
# Opt level: O2

void astcenc_context_free(astcenc_context *ctxo)

{
  if (ctxo != (astcenc_context *)0x0) {
    free((ctxo->context).working_buffers);
    free((ctxo->context).bsd);
    astcenc_context::~astcenc_context(ctxo);
    operator_delete(ctxo,0x2e8);
    return;
  }
  return;
}

Assistant:

void astcenc_context_free(
	astcenc_context* ctxo
) {
	if (ctxo)
	{
		astcenc_contexti* ctx = &ctxo->context;
		aligned_free<compression_working_buffers>(ctx->working_buffers);
		aligned_free<block_size_descriptor>(ctx->bsd);
#if defined(ASTCENC_DIAGNOSTICS)
		delete ctx->trace_log;
#endif
		delete ctxo;
	}
}